

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::InvalidateProtoInlineCaches(ThreadContext *this,PropertyId propertyId)

{
  bool bVar1;
  PropertyRecord *pPVar2;
  InlineCacheList *local_20;
  InlineCacheList *inlineCacheList;
  PropertyId propertyId_local;
  
  inlineCacheList._4_4_ = propertyId;
  bVar1 = JsUtil::
          BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove
                    (&this->protoInlineCacheByPropId,(int *)((long)&inlineCacheList + 4),&local_20);
  if (bVar1) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TraceInlineCacheInvalidationPhase);
    if (bVar1) {
      pPVar2 = GetPropertyName(this,inlineCacheList._4_4_);
      Output::Print(L"InlineCacheInvalidation: invalidating proto caches for property %s(%u)\n",
                    pPVar2 + 1,(ulong)inlineCacheList._4_4_);
      Output::Flush();
    }
    InvalidateAndDeleteInlineCacheList(this,local_20);
  }
  return;
}

Assistant:

void
ThreadContext::InvalidateProtoInlineCaches(Js::PropertyId propertyId)
{
    InlineCacheList* inlineCacheList;
    if (protoInlineCacheByPropId.TryGetValueAndRemove(propertyId, &inlineCacheList))
    {
        if (PHASE_TRACE1(Js::TraceInlineCacheInvalidationPhase))
        {
            Output::Print(_u("InlineCacheInvalidation: invalidating proto caches for property %s(%u)\n"),
                GetPropertyName(propertyId)->GetBuffer(), propertyId);
            Output::Flush();
        }

        InvalidateAndDeleteInlineCacheList(inlineCacheList);
    }
}